

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint aom_highbd_8_mse16x8_c(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint32_t *sse)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar12 = (long)ref * 2;
  lVar13 = (long)src * 2;
  iVar14 = 0;
  uVar15 = 0;
  do {
    iVar16 = 0;
    iVar17 = 0;
    iVar18 = 0;
    lVar11 = 0;
    do {
      uVar1 = *(ulong *)(lVar13 + lVar11 * 2);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = (short)(uVar1 >> 0x30);
      auVar5._8_2_ = (short)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._10_4_ = auVar3._10_4_;
      auVar9._6_8_ = 0;
      auVar9._0_6_ = auVar5._8_6_;
      auVar7._4_2_ = (short)(uVar1 >> 0x10);
      auVar7._0_4_ = (uint)uVar1;
      auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
      uVar2 = *(ulong *)(lVar12 + lVar11 * 2);
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar2;
      auVar4._12_2_ = (short)(uVar2 >> 0x30);
      auVar6._8_2_ = (short)(uVar2 >> 0x20);
      auVar6._0_8_ = uVar2;
      auVar6._10_4_ = auVar4._10_4_;
      auVar10._6_8_ = 0;
      auVar10._0_6_ = auVar6._8_6_;
      auVar8._4_2_ = (short)(uVar2 >> 0x10);
      auVar8._0_4_ = (uint)uVar2;
      auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
      auVar19._0_4_ = ((uint)uVar1 & 0xffff) - ((uint)uVar2 & 0xffff);
      auVar19._4_4_ = auVar7._4_4_ - auVar8._4_4_;
      auVar19._8_4_ = auVar5._8_4_ - auVar6._8_4_;
      auVar19._12_4_ = (auVar3._10_4_ >> 0x10) - (auVar4._10_4_ >> 0x10);
      auVar20._4_4_ = auVar19._4_4_;
      auVar20._0_4_ = auVar19._4_4_;
      auVar20._8_4_ = auVar19._12_4_;
      auVar20._12_4_ = auVar19._12_4_;
      uVar15 = uVar15 + auVar19._0_4_ * auVar19._0_4_;
      iVar16 = iVar16 + auVar19._4_4_ * auVar19._4_4_;
      iVar17 = iVar17 + (int)((auVar19._8_8_ & 0xffffffff) * (auVar19._8_8_ & 0xffffffff));
      iVar18 = iVar18 + (int)((auVar20._8_8_ & 0xffffffff) * (auVar20._8_8_ & 0xffffffff));
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x10);
    uVar15 = iVar18 + iVar16 + iVar17 + uVar15;
    iVar14 = iVar14 + 1;
    lVar13 = lVar13 + (long)src_stride * 2;
    lVar12 = lVar12 + (long)ref_stride * 2;
  } while (iVar14 != 8);
  *sse = uVar15;
  return uVar15;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}